

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_quantize_avx2.c
# Opt level: O0

void aom_quantize_b_adaptive_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  __m256i dequant_00;
  __m256i dequant_01;
  __m256i qcoeff_00;
  __m256i qcoeff_01;
  __m256i coeff_vals;
  __m256i coeff_vals_00;
  __m256i coeff_vals_01;
  __m256i coeff_vals_02;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 is_found;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long in_RDX;
  long in_RSI;
  int16_t *piVar11;
  long in_RDI;
  tran_low_t *ptVar12;
  longlong in_R9;
  undefined8 uVar13;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar14 [32];
  undefined8 uVar19;
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  __m128i mask;
  __m128i mask_00;
  undefined8 *in_stack_00000008;
  int rc_3;
  int qcoeff0;
  int rc_2;
  int i_3;
  int rc_1;
  int i_2;
  int rc;
  int i_1;
  __m256i temp0;
  int first;
  __m256i threshold [2];
  int i;
  qm_val_t wt;
  int thresh [2];
  int prescan_add [2];
  __m128i temp_mask1;
  __m128i temp_mask0;
  __m256i mask1;
  __m256i mask0;
  __m256i cmp_mask;
  __m256i qcoeff;
  __m256i coeff;
  __m256i shift;
  __m256i dequant;
  __m256i quant;
  __m256i round;
  __m256i zbin;
  __m256i zero;
  int eob;
  int is_found1;
  int is_found0;
  int non_zero_count_prescan_add_zero;
  int non_zero_count;
  int index;
  tran_low_t *ptVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff58c;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  undefined4 in_stack_fffffffffffff598;
  undefined4 in_stack_fffffffffffff59c;
  undefined4 in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a4;
  undefined4 in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5ac;
  undefined4 in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b4;
  int iVar23;
  int local_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  tran_low_t *ptVar24;
  longlong lVar25;
  undefined1 in_stack_fffffffffffff5e0 [24];
  int local_a04;
  undefined1 local_a00 [16];
  int16_t *iscan_ptr;
  __m256i *threshold_00;
  __m256i *qcoeff_02;
  int local_9b8;
  uint local_9b0 [4];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  int local_808;
  int local_804;
  int local_800;
  int local_7fc;
  int local_7f8;
  int local_7f4;
  long local_7d8;
  long local_7d0;
  long local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  uint local_788;
  uint local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  long lStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  long lStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 (*local_408) [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  tran_low_t *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  tran_low_t *local_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  tran_low_t *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 *local_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  tran_low_t *ptStack_1b0;
  longlong lStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  tran_low_t *ptStack_170;
  longlong lStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [32];
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  local_7f4 = 0x10;
  local_7f8 = 0;
  local_7fc = 0;
  local_800 = 0;
  local_804 = 0;
  local_808 = -1;
  local_7c0 = 0;
  uStack_7b8 = 0;
  uStack_7b0 = 0;
  uStack_7a8 = 0;
  local_840 = 0;
  uStack_838 = 0;
  uStack_830 = 0;
  uStack_828 = 0;
  local_960 = 0;
  uStack_958 = 0;
  uStack_950 = 0;
  uStack_948 = 0;
  local_980 = 0;
  uStack_978 = 0;
  uStack_970 = 0;
  uStack_968 = 0;
  for (local_9b8 = 0; local_9b8 < 2; local_9b8 = local_9b8 + 1) {
    local_9b0[(long)local_9b8 + 2] =
         *(short *)((long)dqcoeff_ptr + (long)local_9b8 * 2) * 0x145 + 0x40 >> 7;
    local_9b0[local_9b8] =
         (*(short *)(in_RDX + (long)local_9b8 * 2) * 0x20 + local_9b0[(long)local_9b8 + 2]) - 1;
  }
  local_784 = local_9b0[0];
  local_84 = local_9b0[0];
  local_88 = local_9b0[0];
  local_8c = local_9b0[0];
  local_90 = local_9b0[0];
  local_94 = local_9b0[0];
  local_98 = local_9b0[0];
  local_9c = local_9b0[0];
  local_a0 = local_9b0[0];
  auVar2 = vpinsrd_avx(ZEXT416(local_9b0[0]),local_9b0[0],1);
  auVar2 = vpinsrd_avx(auVar2,local_9b0[0],2);
  local_c0 = vpinsrd_avx(auVar2,local_9b0[0],3);
  auVar2 = vpinsrd_avx(ZEXT416(local_9b0[0]),local_9b0[0],1);
  auVar2 = vpinsrd_avx(auVar2,local_9b0[0],2);
  auStack_b0 = vpinsrd_avx(auVar2,local_9b0[0],3);
  stack0xfffffffffffff610 = (__m256i *)auStack_b0._0_8_;
  local_a00 = local_c0;
  stack0xfffffffffffff618 = (int *)auStack_b0._8_8_;
  local_788 = local_9b0[1];
  local_34 = local_9b0[1];
  local_38 = local_9b0[1];
  local_3c = local_9b0[1];
  local_40 = local_9b0[1];
  local_44 = local_9b0[1];
  local_48 = local_9b0[1];
  local_4c = local_9b0[1];
  local_50 = local_9b0[1];
  auVar2 = vpinsrd_avx(ZEXT416(local_9b0[1]),local_9b0[1],1);
  auVar2 = vpinsrd_avx(auVar2,local_9b0[1],2);
  local_80 = vpinsrd_avx(auVar2,local_9b0[1],3);
  auVar2 = vpinsrd_avx(ZEXT416(local_9b0[1]),local_9b0[1],1);
  auVar2 = vpinsrd_avx(auVar2,local_9b0[1],2);
  auStack_70._0_16_ = vpinsrd_avx(auVar2,local_9b0[1],3);
  is_found = auStack_70._8_8_;
  auVar15._16_8_ = auStack_70._0_8_;
  auVar15._0_16_ = local_80;
  auVar15._24_8_ = auStack_70._8_8_;
  auVar15 = vpblendd_avx2(auVar15,_local_a00,1);
  local_a04 = -1;
  puVar22 = local_8e0;
  puVar21 = local_8c0;
  auVar14 = ZEXT1632(auVar15._0_16_);
  ptVar20 = dqcoeff_ptr;
  iscan_ptr = (int16_t *)local_80._0_8_;
  threshold_00 = (__m256i *)local_80._8_8_;
  qcoeff_02 = (__m256i *)auStack_70._0_8_;
  local_7d8 = in_RDX;
  local_7d0 = in_RSI;
  local_7c8 = in_RDI;
  load_b_values_avx2();
  load_coefficients_avx2
            ((tran_low_t *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
  local_900._0_8_ = auVar14._0_8_;
  local_900._8_8_ = auVar14._8_8_;
  local_900._16_8_ = auVar14._16_8_;
  local_900._24_8_ = auVar14._24_8_;
  local_760 = local_900._0_8_;
  uStack_758 = local_900._8_8_;
  uStack_750 = local_900._16_8_;
  uStack_748 = local_900._24_8_;
  local_920 = vpabsw_avx2(auVar14);
  stack0xfffffffffffff618 = auVar15._24_8_;
  stack0xfffffffffffff610 = auVar15._16_8_;
  local_900 = auVar14;
  update_mask0_avx2(qcoeff_02,threshold_00,iscan_ptr,stack0xfffffffffffff618,stack0xfffffffffffff610
                   );
  local_6e0 = local_920._0_8_;
  uStack_6d8 = local_920._8_8_;
  uStack_6d0 = local_920._16_8_;
  uStack_6c8 = local_920._24_8_;
  local_700 = local_860._0_8_;
  uStack_6f8 = local_860._8_8_;
  uStack_6f0 = local_860._16_8_;
  uStack_6e8 = local_860._24_8_;
  auVar15 = vpcmpgtw_avx2(local_920,local_860);
  local_a40 = auVar15._0_8_;
  uStack_a38 = auVar15._8_8_;
  ptVar24 = auVar15._16_8_;
  lVar25 = auVar15._24_8_;
  local_4a0 = local_860._0_8_;
  uStack_498 = local_860._8_8_;
  uStack_490 = local_860._16_8_;
  uStack_488 = local_860._24_8_;
  local_4c0 = local_860._0_8_;
  uStack_4b8 = local_860._8_8_;
  uStack_4b0 = local_860._16_8_;
  uStack_4a8 = local_860._24_8_;
  local_860 = vpunpckhqdq_avx2(local_860,local_860);
  local_940 = vpermq_avx2(auVar15,0xd8);
  ptVar12 = (tran_low_t *)local_940;
  piVar11 = scan;
  update_mask1_avx2((__m256i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                    (int16_t *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                    (int *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                    (__m256i *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
  local_460 = local_940._0_8_;
  uStack_458 = local_940._8_8_;
  uStack_450 = local_940._16_8_;
  lStack_448 = local_940._24_8_;
  unique0x10003008 = qcoeff_02;
  if ((((((((((((((((((((((((((((((((local_940 >> 7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (local_940 >> 0xf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_940 >> 0x17 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_940 >> 0x1f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_940 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_940 >> 0x2f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_940 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_940 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_940 >> 0x47 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_940 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_940 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_940 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_940 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_940 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_940 >> 0x7f,0) == '\0') &&
                    (local_940 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_940 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_940 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_940 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_940 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_940 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_940 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_940 >> 0xbf,0) == '\0') &&
            (local_940 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_940 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_940 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_940 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_940 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (local_940 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (local_940 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      -1 < (long)local_940._24_8_) {
    local_248 = in_stack_00000008;
    local_280 = local_840;
    uStack_278 = uStack_838;
    uStack_270 = uStack_830;
    uStack_268 = uStack_828;
    *in_stack_00000008 = local_840;
    in_stack_00000008[1] = uStack_838;
    in_stack_00000008[2] = uStack_830;
    in_stack_00000008[3] = uStack_828;
    local_288 = in_stack_00000008 + 4;
    local_2c0 = local_840;
    uStack_2b8 = uStack_838;
    uStack_2b0 = uStack_830;
    uStack_2a8 = uStack_828;
    *local_288 = local_840;
    in_stack_00000008[5] = uStack_838;
    in_stack_00000008[6] = uStack_830;
    in_stack_00000008[7] = uStack_828;
    local_2c8 = qcoeff_ptr;
    local_300 = local_840;
    uStack_2f8 = uStack_838;
    uStack_2f0 = uStack_830;
    uStack_2e8 = uStack_828;
    *(undefined8 *)qcoeff_ptr = local_840;
    *(undefined8 *)(qcoeff_ptr + 2) = uStack_838;
    *(undefined8 *)(qcoeff_ptr + 4) = uStack_830;
    *(undefined8 *)(qcoeff_ptr + 6) = uStack_828;
    local_308 = qcoeff_ptr + 8;
    local_340 = local_840;
    uStack_338 = uStack_838;
    uStack_330 = uStack_830;
    uStack_328 = uStack_828;
    *(undefined8 *)local_308 = local_840;
    *(undefined8 *)(qcoeff_ptr + 10) = uStack_838;
    *(undefined8 *)(qcoeff_ptr + 0xc) = uStack_830;
    *(undefined8 *)(qcoeff_ptr + 0xe) = uStack_828;
    local_4e0 = local_880._0_8_;
    uStack_4d8 = local_880._8_8_;
    uStack_4d0 = local_880._16_8_;
    uStack_4c8 = local_880._24_8_;
    local_500 = local_880._0_8_;
    uStack_4f8 = local_880._8_8_;
    uStack_4f0 = local_880._16_8_;
    uStack_4e8 = local_880._24_8_;
    local_880 = vpunpckhqdq_avx2(local_880,local_880);
    local_520 = local_8a0._0_8_;
    uStack_518 = local_8a0._8_8_;
    uStack_510 = local_8a0._16_8_;
    uStack_508 = local_8a0._24_8_;
    local_540 = local_8a0._0_8_;
    uStack_538 = local_8a0._8_8_;
    uStack_530 = local_8a0._16_8_;
    uStack_528 = local_8a0._24_8_;
    local_8a0 = vpunpckhqdq_avx2(local_8a0,local_8a0);
    local_560 = local_8e0._0_8_;
    uStack_558 = local_8e0._8_8_;
    uStack_550 = local_8e0._16_8_;
    uStack_548 = local_8e0._24_8_;
    local_580 = local_8e0._0_8_;
    uStack_578 = local_8e0._8_8_;
    uStack_570 = local_8e0._16_8_;
    uStack_568 = local_8e0._24_8_;
    local_8e0 = vpunpckhqdq_avx2(local_8e0,local_8e0);
    local_5a0 = local_8c0._0_8_;
    uStack_598 = local_8c0._8_8_;
    uStack_590 = local_8c0._16_8_;
    uStack_588 = local_8c0._24_8_;
    local_5c0 = local_8c0._0_8_;
    uStack_5b8 = local_8c0._8_8_;
    uStack_5b0 = local_8c0._16_8_;
    uStack_5a8 = local_8c0._24_8_;
    local_8c0 = vpunpckhqdq_avx2(local_8c0,local_8c0);
    auVar16 = ZEXT3264(local_8c0);
    uVar9 = local_9b0[0];
    uVar10 = local_9b0[1];
  }
  else {
    piVar11 = (int16_t *)local_880;
    calculate_qcoeff_avx2
              ((__m256i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
               (__m256i *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
               (__m256i *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
    local_5e0 = local_880._0_8_;
    uStack_5d8 = local_880._8_8_;
    uStack_5d0 = local_880._16_8_;
    uStack_5c8 = local_880._24_8_;
    local_600 = local_880._0_8_;
    uStack_5f8 = local_880._8_8_;
    uStack_5f0 = local_880._16_8_;
    uStack_5e8 = local_880._24_8_;
    local_880 = vpunpckhqdq_avx2(local_880,local_880);
    local_620 = local_8a0._0_8_;
    uStack_618 = local_8a0._8_8_;
    uStack_610 = local_8a0._16_8_;
    uStack_608 = local_8a0._24_8_;
    local_640 = local_8a0._0_8_;
    uStack_638 = local_8a0._8_8_;
    uStack_630 = local_8a0._16_8_;
    uStack_628 = local_8a0._24_8_;
    local_8a0 = vpunpckhqdq_avx2(local_8a0,local_8a0);
    local_660 = local_8e0._0_8_;
    uStack_658 = local_8e0._8_8_;
    uStack_650 = local_8e0._16_8_;
    uStack_648 = local_8e0._24_8_;
    local_680 = local_8e0._0_8_;
    uStack_678 = local_8e0._8_8_;
    uStack_670 = local_8e0._16_8_;
    uStack_668 = local_8e0._24_8_;
    local_8e0 = vpunpckhqdq_avx2(local_8e0,local_8e0);
    local_1e0 = local_920._0_8_;
    uStack_1d8 = local_920._8_8_;
    uStack_1d0 = local_920._16_8_;
    uStack_1c8 = local_920._24_8_;
    local_200 = local_900._0_8_;
    uStack_1f8 = local_900._8_8_;
    uStack_1f0 = local_900._16_8_;
    uStack_1e8 = local_900._24_8_;
    auVar14 = vpsignw_avx2(local_920,local_900);
    local_920._0_8_ = auVar14._0_8_;
    local_920._8_8_ = auVar14._8_8_;
    local_920._16_8_ = auVar14._16_8_;
    local_920._24_8_ = auVar14._24_8_;
    local_160 = local_920._0_8_;
    uStack_158 = local_920._8_8_;
    uStack_150 = local_920._16_8_;
    uStack_148 = local_920._24_8_;
    local_180 = local_a40;
    uStack_178 = uStack_a38;
    auVar4._16_8_ = ptVar24;
    auVar4._0_16_ = auVar15._0_16_;
    auVar4._24_8_ = lVar25;
    local_920 = vpand_avx2(auVar14,auVar4);
    coeff_vals[1] = in_stack_fffffffffffff5e0._0_8_;
    coeff_vals[2] = in_stack_fffffffffffff5e0._8_8_;
    coeff_vals[3] = in_stack_fffffffffffff5e0._16_8_;
    coeff_vals[0] = lVar25;
    ptStack_170 = ptVar24;
    lStack_168 = lVar25;
    store_coefficients_avx2(coeff_vals,ptVar24);
    qcoeff_00[1]._0_4_ = in_stack_fffffffffffff580;
    qcoeff_00[0] = (longlong)puVar22;
    qcoeff_00[1]._4_4_ = local_9b0[0];
    qcoeff_00[2]._0_4_ = local_9b0[1];
    qcoeff_00[2]._4_4_ = in_stack_fffffffffffff58c;
    qcoeff_00[3]._0_4_ = in_stack_fffffffffffff590;
    qcoeff_00[3]._4_4_ = in_stack_fffffffffffff594;
    dequant_00[1] = (longlong)ptVar20;
    dequant_00[0] = 0x619225;
    dequant_00[2] = (longlong)puVar21;
    dequant_00[3] = in_R9;
    uVar13 = local_920._0_8_;
    uVar17 = local_920._8_8_;
    uVar18 = local_920._16_8_;
    uVar19 = local_920._24_8_;
    calculate_dqcoeff_avx2(qcoeff_00,dequant_00);
    local_900._8_8_ = uVar17;
    local_900._0_8_ = uVar13;
    local_900._16_8_ = uVar18;
    local_900._24_8_ = uVar19;
    local_6a0 = local_8c0._0_8_;
    uStack_698 = local_8c0._8_8_;
    uStack_690 = local_8c0._16_8_;
    uStack_688 = local_8c0._24_8_;
    local_6c0 = local_8c0._0_8_;
    uStack_6b8 = local_8c0._8_8_;
    uStack_6b0 = local_8c0._16_8_;
    uStack_6a8 = local_8c0._24_8_;
    local_8c0 = vpunpckhqdq_avx2(local_8c0,local_8c0);
    auVar16 = ZEXT3264(local_900);
    coeff_vals_00[1] = in_stack_fffffffffffff5e0._0_8_;
    coeff_vals_00[2] = in_stack_fffffffffffff5e0._8_8_;
    coeff_vals_00[3] = in_stack_fffffffffffff5e0._16_8_;
    coeff_vals_00[0] = lVar25;
    ptVar12 = qcoeff_ptr;
    store_coefficients_avx2(coeff_vals_00,ptVar24);
    uVar9 = local_9b0[0];
    uVar10 = local_9b0[1];
  }
  while (auVar15 = auVar16._0_32_, local_7f4 < local_7d0) {
    load_coefficients_avx2
              ((tran_low_t *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
    local_900._0_8_ = auVar15._0_8_;
    local_900._8_8_ = auVar15._8_8_;
    local_900._16_8_ = auVar15._16_8_;
    local_900._24_8_ = auVar15._24_8_;
    local_780 = local_900._0_8_;
    uStack_778 = local_900._8_8_;
    uStack_770 = local_900._16_8_;
    uStack_768 = local_900._24_8_;
    local_920 = vpabsw_avx2(auVar15);
    local_900 = auVar15;
    update_mask0_avx2(stack0xfffffffffffff630,threshold_00,iscan_ptr,(int *)is_found,qcoeff_02);
    local_720 = local_920._0_8_;
    uStack_718 = local_920._8_8_;
    uStack_710 = local_920._16_8_;
    uStack_708 = local_920._24_8_;
    local_740 = local_860._0_8_;
    uStack_738 = local_860._8_8_;
    uStack_730 = local_860._16_8_;
    uStack_728 = local_860._24_8_;
    auVar15 = vpcmpgtw_avx2(local_920,local_860);
    local_a40 = auVar15._0_8_;
    uStack_a38 = auVar15._8_8_;
    ptVar24 = auVar15._16_8_;
    lVar25 = auVar15._24_8_;
    local_940 = vpermq_avx2(auVar15,0xd8);
    piVar11 = scan + local_7f4;
    ptVar12 = (tran_low_t *)local_940;
    update_mask1_avx2((__m256i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                      (int16_t *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                      (int *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                      (__m256i *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
    local_480 = local_940._0_8_;
    uStack_478 = local_940._8_8_;
    uStack_470 = local_940._16_8_;
    lStack_468 = local_940._24_8_;
    if ((((((((((((((((((((((((((((((((local_940 >> 7 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (local_940 >> 0xf & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_940 >> 0x17 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_940 >> 0x1f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_940 >> 0x27 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                                 (local_940 >> 0x2f & (undefined1  [32])0x1) ==
                                 (undefined1  [32])0x0) &&
                                (local_940 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_940 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_940 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_940 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_940 >> 0x57 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_940 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (local_940 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_940 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_940 >> 0x7f,0) == '\0') &&
                      (local_940 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_940 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_940 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_940 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_940 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (local_940 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_940 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_940 >> 0xbf,0) == '\0') &&
              (local_940 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (local_940 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_940 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (local_940 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (local_940 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (local_940 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (local_940 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        -1 < (long)local_940._24_8_) {
      local_348 = (undefined8 *)((long)in_stack_00000008 + (long)local_7f4 * 4);
      local_380 = local_840;
      uStack_378 = uStack_838;
      uStack_370 = uStack_830;
      uStack_368 = uStack_828;
      *local_348 = local_840;
      local_348[1] = uStack_838;
      local_348[2] = uStack_830;
      local_348[3] = uStack_828;
      local_388 = (undefined8 *)((long)in_stack_00000008 + (long)local_7f4 * 4 + 0x20);
      local_3c0 = local_840;
      uStack_3b8 = uStack_838;
      uStack_3b0 = uStack_830;
      uStack_3a8 = uStack_828;
      *local_388 = local_840;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_7f4 * 4 + 0x28) = uStack_838;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_7f4 * 4 + 0x30) = uStack_830;
      *(undefined8 *)((long)in_stack_00000008 + (long)local_7f4 * 4 + 0x38) = uStack_828;
      local_3c8 = qcoeff_ptr + local_7f4;
      local_400 = local_840;
      uStack_3f8 = uStack_838;
      uStack_3f0 = uStack_830;
      uStack_3e8 = uStack_828;
      *(undefined8 *)local_3c8 = local_840;
      *(undefined8 *)(local_3c8 + 2) = uStack_838;
      *(undefined8 *)(local_3c8 + 4) = uStack_830;
      *(undefined8 *)(local_3c8 + 6) = uStack_828;
      local_408 = (undefined1 (*) [32])(qcoeff_ptr + (long)local_7f4 + 8);
      local_440 = local_840;
      uStack_438 = uStack_838;
      uStack_430 = uStack_830;
      uStack_428 = uStack_828;
      auVar14._8_8_ = uStack_838;
      auVar14._0_8_ = local_840;
      auVar14._16_8_ = uStack_830;
      auVar14._24_8_ = uStack_828;
      auVar16 = ZEXT3264(auVar14);
      *local_408 = auVar14;
      local_7f4 = local_7f4 + 0x10;
    }
    else {
      piVar11 = (int16_t *)local_880;
      calculate_qcoeff_avx2
                ((__m256i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff5ac,in_stack_fffffffffffff5a8),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598));
      local_220 = local_920._0_8_;
      uStack_218 = local_920._8_8_;
      uStack_210 = local_920._16_8_;
      uStack_208 = local_920._24_8_;
      local_240 = local_900._0_8_;
      uStack_238 = local_900._8_8_;
      uStack_230 = local_900._16_8_;
      uStack_228 = local_900._24_8_;
      auVar14 = vpsignw_avx2(local_920,local_900);
      local_920._0_8_ = auVar14._0_8_;
      local_920._8_8_ = auVar14._8_8_;
      local_920._16_8_ = auVar14._16_8_;
      local_920._24_8_ = auVar14._24_8_;
      local_1a0 = local_920._0_8_;
      uStack_198 = local_920._8_8_;
      uStack_190 = local_920._16_8_;
      uStack_188 = local_920._24_8_;
      local_1c0 = local_a40;
      uStack_1b8 = uStack_a38;
      auVar3._16_8_ = ptVar24;
      auVar3._0_16_ = auVar15._0_16_;
      auVar3._24_8_ = lVar25;
      local_920 = vpand_avx2(auVar14,auVar3);
      coeff_vals_01[1] = in_stack_fffffffffffff5e0._0_8_;
      coeff_vals_01[2] = in_stack_fffffffffffff5e0._8_8_;
      coeff_vals_01[3] = in_stack_fffffffffffff5e0._16_8_;
      coeff_vals_01[0] = lVar25;
      ptStack_1b0 = ptVar24;
      lStack_1a8 = lVar25;
      store_coefficients_avx2(coeff_vals_01,ptVar24);
      qcoeff_01[1]._0_4_ = in_stack_fffffffffffff580;
      qcoeff_01[0] = (longlong)puVar22;
      qcoeff_01[1]._4_4_ = uVar9;
      qcoeff_01[2]._0_4_ = uVar10;
      qcoeff_01[2]._4_4_ = in_stack_fffffffffffff58c;
      qcoeff_01[3]._0_4_ = in_stack_fffffffffffff590;
      qcoeff_01[3]._4_4_ = in_stack_fffffffffffff594;
      dequant_01[1] = (longlong)ptVar20;
      dequant_01[0] = 0x6195c6;
      dequant_01[2] = (longlong)puVar21;
      dequant_01[3] = in_R9;
      uVar13 = local_920._0_8_;
      uVar17 = local_920._8_8_;
      uVar18 = local_920._16_8_;
      uVar19 = local_920._24_8_;
      calculate_dqcoeff_avx2(qcoeff_01,dequant_01);
      local_900._8_8_ = uVar17;
      local_900._0_8_ = uVar13;
      local_900._16_8_ = uVar18;
      local_900._24_8_ = uVar19;
      auVar16 = ZEXT3264(local_900);
      ptVar12 = qcoeff_ptr + local_7f4;
      coeff_vals_02[1] = in_stack_fffffffffffff5e0._0_8_;
      coeff_vals_02[2] = in_stack_fffffffffffff5e0._8_8_;
      coeff_vals_02[3] = in_stack_fffffffffffff5e0._16_8_;
      coeff_vals_02[0] = lVar25;
      store_coefficients_avx2(coeff_vals_02,ptVar24);
      local_7f4 = local_7f4 + 0x10;
    }
  }
  if (local_800 != 0) {
    local_e0 = local_960;
    uStack_d8 = uStack_958;
    uStack_d0 = uStack_950;
    uStack_c8 = uStack_948;
    local_110 = local_960;
    uStack_108 = uStack_958;
    local_120 = uStack_950;
    uStack_118 = uStack_948;
    auVar7._8_8_ = uStack_958;
    auVar7._0_8_ = local_960;
    auVar2._8_8_ = uStack_948;
    auVar2._0_8_ = uStack_950;
    local_990 = vpmaxsw_avx(auVar7,auVar2);
    mask[1] = (longlong)piVar11;
    mask[0] = (longlong)ptVar12;
    local_7f8 = calculate_non_zero_count(mask);
  }
  local_a44 = local_7fc;
  if (local_804 != 0) {
    local_100 = local_980;
    uStack_f8 = uStack_978;
    uStack_f0 = uStack_970;
    uStack_e8 = uStack_968;
    local_130 = local_980;
    uStack_128 = uStack_978;
    local_140 = uStack_970;
    uStack_138 = uStack_968;
    auVar6._8_8_ = uStack_978;
    auVar6._0_8_ = local_980;
    auVar5._8_8_ = uStack_968;
    auVar5._0_8_ = uStack_970;
    local_9a0 = vpmaxsw_avx(auVar6,auVar5);
    mask_00[1] = (longlong)piVar11;
    mask_00[0] = (longlong)ptVar12;
    local_a44 = calculate_non_zero_count(mask_00);
  }
  while (local_a44 = local_a44 + -1, iVar23 = local_7f8, local_7f8 <= local_a44) {
    uVar1 = eob_ptr[local_a44];
    *(undefined4 *)((long)in_stack_00000008 + (long)(int)(short)uVar1 * 4) = 0;
    qcoeff_ptr[(int)(short)uVar1] = 0;
  }
  do {
    iVar23 = iVar23 + -1;
    iVar8 = local_808;
    if (iVar23 < 0) break;
    iVar8 = iVar23;
  } while (*(int *)((long)in_stack_00000008 + (long)(int)(short)eob_ptr[iVar23] * 4) == 0);
  local_808 = iVar8;
  *dequant_ptr = (short)local_808 + 1;
  iVar23 = 0;
  while ((iVar8 = local_a04, iVar23 < local_7f8 &&
         (iVar8 = iVar23,
         *(int *)((long)in_stack_00000008 + (long)(int)(short)eob_ptr[iVar23] * 4) == 0))) {
    iVar23 = iVar23 + 1;
  }
  local_a04 = iVar8;
  if (((-1 < (int)((ushort)*dequant_ptr - 1)) && (local_a04 == (ushort)*dequant_ptr - 1)) &&
     ((iVar23 = (int)(short)eob_ptr[(int)((ushort)*dequant_ptr - 1)],
      *(int *)((long)in_stack_00000008 + (long)iVar23 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar23 * 4) == -1)))) {
    uVar9 = *(int *)(local_7c8 + (long)iVar23 * 4) << 5;
    uVar10 = 0;
    if ((int)uVar9 < 0) {
      uVar10 = 0xffffffff;
    }
    if ((int)((uVar9 ^ uVar10) - uVar10) <
        *(short *)(local_7d8 + (long)(int)(uint)(iVar23 != 0) * 2) * 0x20 +
        (*(short *)((long)dqcoeff_ptr + (long)(int)(uint)(iVar23 != 0) * 2) * 0x20d + 0x40 >> 7)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar23 * 4) = 0;
      qcoeff_ptr[iVar23] = 0;
      *dequant_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_quantize_b_adaptive_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 16;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m256i zero = _mm256_setzero_si256();
  __m256i zbin, round, quant, dequant, shift;
  __m256i coeff, qcoeff;
  __m256i cmp_mask, mask0 = zero, mask1 = zero;
  __m128i temp_mask0, temp_mask1;
  int prescan_add[2];
  int thresh[2];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  __m256i threshold[2];
  threshold[0] = _mm256_set1_epi32(thresh[0]);
  threshold[1] = _mm256_set1_epi32(thresh[1]);
  threshold[0] = _mm256_blend_epi32(threshold[0], threshold[1], 0xfe);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif

  // Setup global values.
  load_b_values_avx2(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                     dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff = load_coefficients_avx2(coeff_ptr);
  qcoeff = _mm256_abs_epi16(coeff);
  update_mask0_avx2(&qcoeff, threshold, iscan, &is_found0, &mask0);
  __m256i temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
  zbin = _mm256_unpackhi_epi64(zbin, zbin);
  cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
  update_mask1_avx2(&cmp_mask, iscan, &is_found1, &mask1);
  threshold[0] = threshold[1];
  if (_mm256_movemask_epi8(cmp_mask) == 0) {
    _mm256_store_si256((__m256i *)(qcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(qcoeff_ptr + 8), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr), zero);
    _mm256_store_si256((__m256i *)(dqcoeff_ptr + 8), zero);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    round = _mm256_unpackhi_epi64(round, round);
    quant = _mm256_unpackhi_epi64(quant, quant);
    shift = _mm256_unpackhi_epi64(shift, shift);
    // Reinsert signs
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    // Mask out zbin threshold coeffs
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    dequant = _mm256_unpackhi_epi64(dequant, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff = load_coefficients_avx2(coeff_ptr + index);
    qcoeff = _mm256_abs_epi16(coeff);
    update_mask0_avx2(&qcoeff, threshold, iscan + index, &is_found0, &mask0);
    temp0 = _mm256_cmpgt_epi16(qcoeff, zbin);
    cmp_mask = _mm256_permute4x64_epi64(temp0, 0xd8);
    update_mask1_avx2(&cmp_mask, iscan + index, &is_found1, &mask1);
    if (_mm256_movemask_epi8(cmp_mask) == 0) {
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(qcoeff_ptr + index + 8), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index), zero);
      _mm256_store_si256((__m256i *)(dqcoeff_ptr + index + 8), zero);
      index += 16;
      continue;
    }
    calculate_qcoeff_avx2(&qcoeff, &round, &quant, &shift);
    qcoeff = _mm256_sign_epi16(qcoeff, coeff);
    qcoeff = _mm256_and_si256(qcoeff, temp0);
    store_coefficients_avx2(qcoeff, qcoeff_ptr + index);
    coeff = calculate_dqcoeff_avx2(qcoeff, dequant);
    store_coefficients_avx2(coeff, dqcoeff_ptr + index);
    index += 16;
  }
  if (is_found0) {
    temp_mask0 = _mm_max_epi16(_mm256_castsi256_si128(mask0),
                               _mm256_extracti128_si256(mask0, 1));
    non_zero_count = calculate_non_zero_count(temp_mask0);
  }
  if (is_found1) {
    temp_mask1 = _mm_max_epi16(_mm256_castsi256_si128(mask1),
                               _mm256_extracti128_si256(mask1, 1));
    non_zero_count_prescan_add_zero = calculate_non_zero_count(temp_mask1);
  }

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff0 = qcoeff_ptr[rc];
    if (qcoeff0) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff0 = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff0);
      const int abs_coeff = (coeff0 ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}